

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match_sse4.c
# Opt level: O3

double aom_compute_correlation_sse4_1
                 (uchar *frame1,int stride1,int x1,int y1,double mean1,double one_over_stddev1,
                 uchar *frame2,int stride2,int x2,int y2,double mean2,double one_over_stddev2)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  int iVar3;
  int iVar4;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar5 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 in_XMM9 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar14 [16];
  
  pauVar1 = (undefined1 (*) [16])(frame1 + (x1 + (y1 + -7) * stride1 + -7));
  pauVar2 = (undefined1 (*) [16])(frame2 + (x2 + (y2 + -7) * stride2 + -7));
  iVar3 = 0x10;
  iVar4 = 0;
  iVar6 = 0;
  iVar7 = 0;
  iVar8 = 0;
  iVar9 = 0;
  iVar10 = 0;
  iVar11 = 0;
  iVar12 = 0;
  do {
    auVar14 = *pauVar1;
    auVar5 = *pauVar2;
    in_XMM9 = pmovzxbw(in_XMM9,auVar14);
    auVar13[1] = 0;
    auVar13[0] = auVar14[8];
    auVar13[2] = auVar14[9];
    auVar13[3] = 0;
    auVar13[4] = auVar14[10];
    auVar13[5] = 0;
    auVar13[6] = auVar14[0xb];
    auVar13[7] = 0;
    auVar13[8] = auVar14[0xc];
    auVar13[9] = 0;
    auVar13[10] = auVar14[0xd];
    auVar13[0xb] = 0;
    auVar13[0xc] = auVar14[0xe];
    auVar13[0xd] = 0;
    auVar13[0xe] = auVar14[0xf];
    auVar13[0xf] = 0;
    auVar14 = pmovzxbw(in_XMM10,auVar5);
    in_XMM10 = pmaddwd(auVar14,in_XMM9);
    iVar4 = iVar4 + in_XMM10._0_4_;
    iVar6 = iVar6 + in_XMM10._4_4_;
    iVar7 = iVar7 + in_XMM10._8_4_;
    iVar8 = iVar8 + in_XMM10._12_4_;
    auVar14[1] = 0;
    auVar14[0] = auVar5[8];
    auVar14[2] = auVar5[9];
    auVar14[3] = 0;
    auVar14[4] = auVar5[10];
    auVar14[5] = 0;
    auVar14[6] = auVar5[0xb];
    auVar14[7] = 0;
    auVar14[8] = auVar5[0xc];
    auVar14[9] = 0;
    auVar14[10] = auVar5[0xd];
    auVar14[0xb] = 0;
    auVar14[0xc] = auVar5[0xe];
    auVar14[0xd] = 0;
    auVar14[0xe] = auVar5[0xf];
    auVar14[0xf] = 0;
    auVar14 = pmaddwd(auVar14,auVar13);
    iVar9 = iVar9 + auVar14._0_4_;
    iVar10 = iVar10 + auVar14._4_4_;
    iVar11 = iVar11 + auVar14._8_4_;
    iVar12 = iVar12 + auVar14._12_4_;
    pauVar1 = (undefined1 (*) [16])(*pauVar1 + stride1);
    pauVar2 = (undefined1 (*) [16])(*pauVar2 + stride2);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  auVar5._0_4_ = iVar4 + iVar9;
  auVar5._4_4_ = iVar6 + iVar10;
  auVar5._8_4_ = iVar7 + iVar11;
  auVar5._12_4_ = iVar8 + iVar12;
  auVar14 = phaddd(auVar5,auVar5);
  auVar14 = phaddd(auVar14,auVar14);
  return one_over_stddev1 * one_over_stddev2 * ((double)auVar14._0_4_ - mean1 * mean2);
}

Assistant:

double aom_compute_correlation_sse4_1(const unsigned char *frame1, int stride1,
                                      int x1, int y1, double mean1,
                                      double one_over_stddev1,
                                      const unsigned char *frame2, int stride2,
                                      int x2, int y2, double mean2,
                                      double one_over_stddev2) {
  // 8 32-bit partial sums of products
  __m128i cross_vec_l = _mm_setzero_si128();
  __m128i cross_vec_r = _mm_setzero_si128();

  frame1 += (y1 - MATCH_SZ_BY2) * stride1 + (x1 - MATCH_SZ_BY2);
  frame2 += (y2 - MATCH_SZ_BY2) * stride2 + (x2 - MATCH_SZ_BY2);

  for (int i = 0; i < MATCH_SZ; ++i) {
    const __m128i v1 = _mm_loadu_si128((__m128i *)frame1);
    const __m128i v2 = _mm_loadu_si128((__m128i *)frame2);

    const __m128i v1_l = _mm_cvtepu8_epi16(v1);
    const __m128i v1_r = _mm_cvtepu8_epi16(_mm_srli_si128(v1, 8));
    const __m128i v2_l = _mm_cvtepu8_epi16(v2);
    const __m128i v2_r = _mm_cvtepu8_epi16(_mm_srli_si128(v2, 8));

    cross_vec_l = _mm_add_epi32(cross_vec_l, _mm_madd_epi16(v1_l, v2_l));
    cross_vec_r = _mm_add_epi32(cross_vec_r, _mm_madd_epi16(v1_r, v2_r));

    frame1 += stride1;
    frame2 += stride2;
  }

  // Sum cross_vec into a single value
  const __m128i tmp = _mm_add_epi32(cross_vec_l, cross_vec_r);
  const int cross = _mm_extract_epi32(tmp, 0) + _mm_extract_epi32(tmp, 1) +
                    _mm_extract_epi32(tmp, 2) + _mm_extract_epi32(tmp, 3);

  // Note: In theory, the calculations here "should" be
  //   covariance = cross / N^2 - mean1 * mean2
  //   correlation = covariance / (stddev1 * stddev2).
  //
  // However, because of the scaling in aom_compute_mean_stddev, the
  // lines below actually calculate
  //   covariance * N^2 = cross - (mean1 * N) * (mean2 * N)
  //   correlation = (covariance * N^2) / ((stddev1 * N) * (stddev2 * N))
  //
  // ie. we have removed the need for a division, and still end up with the
  // correct unscaled correlation (ie, in the range [-1, +1])
  const double covariance = cross - mean1 * mean2;
  const double correlation = covariance * (one_over_stddev1 * one_over_stddev2);
  return correlation;
}